

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int XMLDoc_parse_file_DOM_text_as_nodes(SXML_CHAR *filename,XMLDoc *doc,int text_as_nodes)

{
  BOM_TYPE BVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  DOM_through_SAX dom;
  SAX_Callbacks sax;
  XMLDoc *local_78;
  undefined8 local_70;
  int local_60;
  SAX_Callbacks local_58;
  
  iVar3 = 0;
  if (((filename != (SXML_CHAR *)0x0 && doc != (XMLDoc *)0x0) && (iVar3 = 0, *filename != '\0')) &&
     (doc->init_value == 0x19770522)) {
    strncpy(doc->filename,filename,0xff);
    doc->filename[0xff] = '\0';
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      BVar1 = freadBOM((FILE *)__stream,doc->bom,&doc->sz_bom);
      doc->bom_type = BVar1;
      fclose(__stream);
    }
    local_70 = 0;
    local_58.start_doc = DOMXMLDoc_doc_start;
    local_58.start_node = DOMXMLDoc_node_start;
    local_58.end_node = DOMXMLDoc_node_end;
    local_58.new_text = DOMXMLDoc_node_text;
    local_58.on_error = DOMXMLDoc_parse_error;
    local_58.end_doc = DOMXMLDoc_doc_end;
    local_58.all_event = (_func_int_XMLEvent_XMLNode_ptr_SXML_CHAR_ptr_int_SAX_Data_ptr *)0x0;
    local_78 = doc;
    local_60 = text_as_nodes;
    iVar2 = XMLDoc_parse_file_SAX(filename,&local_58,&local_78);
    iVar3 = 1;
    if (iVar2 == 0) {
      XMLDoc_free(doc);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int XMLDoc_parse_file_DOM_text_as_nodes(const SXML_CHAR* filename, XMLDoc* doc, int text_as_nodes)
{
	DOM_through_SAX dom;
	SAX_Callbacks sax;
	int ret;

	if (doc == NULL || filename == NULL || filename[0] == NULC || doc->init_value != XML_INIT_DONE)
		return FALSE;

	sx_strncpy(doc->filename, filename, SXMLC_MAX_PATH - 1);
	doc->filename[SXMLC_MAX_PATH - 1] = NULC;

	/* Read potential BOM on file */
	{
		/* In Unicode, open the file as binary so that further 'fgetwc' read all bytes */
		FILE* f = sx_fopen(filename, C2SX("rb"));
		if (f != NULL) {
			#if defined(SXMLC_UNICODE) && (defined(WIN32) || defined(WIN64))
			/*setvbuf(f, NULL, _IONBF, 0);*/
			#endif
			doc->bom_type = freadBOM(f, doc->bom, &doc->sz_bom);
			sx_fclose(f);
		}
	}

	dom.doc = doc;
	dom.current = NULL;
	dom.text_as_nodes = text_as_nodes;
	SAX_Callbacks_init_DOM(&sax);

	ret = XMLDoc_parse_file_SAX(filename, &sax, &dom);
	if (!ret) {
		(void)XMLDoc_free(doc);
		dom.doc = NULL;
		return ret;
	}

	/* TODO: Check there is no unfinished root nodes */
	return ret;
}